

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# variable.hpp
# Opt level: O2

baseHolder * __thiscall
cs_impl::any::holder<std::shared_ptr<cs::context_type>_>::duplicate
          (holder<std::shared_ptr<cs::context_type>_> *this)

{
  holder<std::shared_ptr<cs::context_type>_> *phVar1;
  
  phVar1 = cs::
           allocator_type<cs_impl::any::holder<std::shared_ptr<cs::context_type>>,64ul,cs_impl::default_allocator_provider>
           ::alloc<std::shared_ptr<cs::context_type>&>
                     ((allocator_type<cs_impl::any::holder<std::shared_ptr<cs::context_type>>,64ul,cs_impl::default_allocator_provider>
                       *)holder<std::shared_ptr<cs::context_type>>::allocator,&this->mDat);
  return &phVar1->super_baseHolder;
}

Assistant:

baseHolder *duplicate() override
			{
				return allocator.alloc(mDat);
			}